

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.hpp
# Opt level: O1

unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridGlobal>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridGlobal> *this,AccelerationContext *acc,istream *is)

{
  long lVar1;
  int *piVar2;
  GridGlobal *this_00;
  void *pvVar3;
  int *piVar4;
  TypeOneDRule TVar5;
  int num_entries;
  long lVar6;
  int *piVar7;
  int *piVar8;
  pointer *__ptr;
  int max_level;
  MultiIndexSet *work;
  int v;
  undefined1 local_108 [104];
  _Alloc_hider local_a0;
  undefined1 local_98 [8];
  undefined1 local_90 [40];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  AccelerationContext *local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_50 = acc;
  Utils::make_unique<TasGrid::GridGlobal,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,&local_50);
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  *(undefined4 *)(*(long *)this + 0x10) = local_108._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  *(undefined4 *)(*(long *)this + 0x14) = local_108._0_4_;
  ::std::istream::_M_extract<double>((double *)is);
  *(ulong *)(*(long *)this + 0x98) = CONCAT44(local_108._4_4_,local_108._0_4_);
  ::std::istream::_M_extract<double>((double *)is);
  *(ulong *)(*(long *)this + 0xa0) = CONCAT44(local_108._4_4_,local_108._0_4_);
  TVar5 = IO::readRule<TasGrid::IO::mode_ascii_type>(is);
  lVar6 = *(long *)this;
  *(TypeOneDRule *)(lVar6 + 0x90) = TVar5;
  if (TVar5 == rule_customtabulated) {
    CustomTabulated::CustomTabulated<TasGrid::IO::mode_ascii_type>((CustomTabulated *)local_108,is);
    lVar1 = *(long *)this;
    *(undefined4 *)(lVar1 + 0x260) = local_108._0_4_;
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x268));
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x280),local_108 + 0x20);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar1 + 0x298);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar1 + 0x2a0);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar1 + 0x2a8);
    *(undefined8 *)(lVar1 + 0x298) = local_108._56_8_;
    *(undefined8 *)(lVar1 + 0x2a0) = local_108._64_8_;
    *(undefined8 *)(lVar1 + 0x2a8) = local_108._72_8_;
    local_108._56_8_ = (pointer)0x0;
    local_108._64_8_ = (pointer)0x0;
    local_108._72_8_ = (pointer)0x0;
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_48);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar1 + 0x2b0);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar1 + 0x2b8);
    local_48.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar1 + 0x2c0);
    *(undefined8 *)(lVar1 + 0x2b0) = local_108._80_8_;
    *(undefined8 *)(lVar1 + 0x2b8) = local_108._88_8_;
    *(undefined8 *)(lVar1 + 0x2c0) = local_108._96_8_;
    lVar6 = 0;
    local_108._80_8_ = (pointer)0x0;
    local_108._88_8_ = (pointer)0x0;
    local_108._96_8_ = (pointer)0x0;
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_48);
    ::std::__cxx11::string::operator=((string *)(lVar1 + 0x2c8),(string *)&local_a0);
    if ((pointer)local_a0._M_p != (pointer)local_90) {
      operator_delete(local_a0._M_p,(ulong)(local_90._0_8_ + 1));
    }
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(local_108 + 0x50));
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(local_108 + 0x38));
    if ((pointer)local_108._32_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._32_8_,local_108._48_8_ - local_108._32_8_);
    }
    pvVar3 = (void *)CONCAT44(local_108._12_4_,local_108._8_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,local_108._24_8_ - (long)pvVar3);
    }
  }
  num_entries = (int)lVar6;
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
  lVar6 = *(long *)this;
  *(undefined4 *)(lVar6 + 0x168) = local_108._8_4_;
  *(ulong *)(lVar6 + 0x160) = CONCAT44(local_108._4_4_,local_108._0_4_);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar6 + 0x170),
             (vector<int,_std::allocator<int>_> *)(local_108 + 0x10));
  if ((pointer)local_108._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._16_8_,local_108._32_8_ - local_108._16_8_);
  }
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
  lVar6 = *(long *)this;
  *(undefined4 *)(lVar6 + 400) = local_108._8_4_;
  *(ulong *)(lVar6 + 0x188) = CONCAT44(local_108._4_4_,local_108._0_4_);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar6 + 0x198),
             (vector<int,_std::allocator<int>_> *)(local_108 + 0x10));
  if ((pointer)local_108._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._16_8_,local_108._32_8_ - local_108._16_8_);
  }
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
             (istream *)(ulong)*(uint *)(*(long *)this + 400),num_entries);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x1b0),local_108);
  pvVar3 = (void *)CONCAT44(local_108._4_4_,local_108._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_108._16_8_ - (long)pvVar3);
  }
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  if (local_108._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
    lVar6 = *(long *)this;
    *(undefined4 *)(lVar6 + 0x20) = local_108._8_4_;
    *(ulong *)(lVar6 + 0x18) = CONCAT44(local_108._4_4_,local_108._0_4_);
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar6 + 0x28),
               (vector<int,_std::allocator<int>_> *)(local_108 + 0x10));
    if ((pointer)local_108._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._16_8_,local_108._32_8_ - local_108._16_8_);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  if (local_108._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
    lVar6 = *(long *)this;
    *(undefined4 *)(lVar6 + 0x48) = local_108._8_4_;
    *(ulong *)(lVar6 + 0x40) = CONCAT44(local_108._4_4_,local_108._0_4_);
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar6 + 0x50),
               (vector<int,_std::allocator<int>_> *)(local_108 + 0x10));
    if ((pointer)local_108._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._16_8_,local_108._32_8_ - local_108._16_8_);
    }
  }
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
             (istream *)(ulong)*(uint *)(*(long *)this + 0x10),num_entries);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x1e0),local_108);
  pvVar3 = (void *)CONCAT44(local_108._4_4_,local_108._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_108._16_8_ - (long)pvVar3);
  }
  if (0 < *(int *)(*(long *)this + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>((StorageSet *)local_108,is);
    lVar6 = *(long *)this;
    *(ulong *)(lVar6 + 0x68) = CONCAT44(local_108._4_4_,local_108._0_4_);
    *(ulong *)(lVar6 + 0x70) = CONCAT44(local_108._12_4_,local_108._8_4_);
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(lVar6 + 0x78),
               (vector<double,_std::allocator<double>_> *)(local_108 + 0x10));
    if ((pointer)local_108._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._16_8_,local_108._32_8_ - local_108._16_8_);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_108);
  if (local_108._0_4_ == 0) {
    piVar8 = *(int **)(*(long *)this + 0x1e0);
    piVar2 = *(int **)(*(long *)this + 0x1e8);
    piVar7 = piVar8 + 1;
    if (piVar7 != piVar2 && piVar8 != piVar2) {
      do {
        piVar4 = piVar7;
        if (*piVar7 <= *piVar8) {
          piVar4 = piVar8;
        }
        piVar8 = piVar4;
        piVar7 = piVar7 + 1;
      } while (piVar7 != piVar2);
    }
    max_level = *piVar8;
  }
  else {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
    lVar6 = *(long *)this;
    *(undefined4 *)(lVar6 + 0x200) = local_108._8_4_;
    *(ulong *)(lVar6 + 0x1f8) = CONCAT44(local_108._4_4_,local_108._0_4_);
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar6 + 0x208),
               (vector<int,_std::allocator<int>_> *)(local_108 + 0x10));
    if ((pointer)local_108._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._16_8_,local_108._32_8_ - local_108._16_8_);
    }
    piVar8 = *(int **)(*(long *)this + 0x208);
    piVar2 = *(int **)(*(long *)this + 0x210);
    piVar7 = piVar8;
    if (piVar8 == piVar2) {
      max_level = 0;
    }
    else {
      while (piVar4 = piVar7, piVar8 = piVar8 + 1, piVar8 != piVar2) {
        piVar7 = piVar8;
        if (*piVar8 <= *piVar4) {
          piVar7 = piVar4;
        }
      }
      num_entries = (int)piVar8;
      max_level = *piVar4;
    }
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_108,is);
    lVar6 = *(long *)this;
    *(undefined4 *)(lVar6 + 0x228) = local_108._8_4_;
    *(ulong *)(lVar6 + 0x220) = CONCAT44(local_108._4_4_,local_108._0_4_);
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar6 + 0x230),
               (vector<int,_std::allocator<int>_> *)(local_108 + 0x10));
    if ((pointer)local_108._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._16_8_,local_108._32_8_ - local_108._16_8_);
    }
    IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
              ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
               (istream *)(ulong)*(uint *)(*(long *)this + 0x228),num_entries);
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(*(long *)this + 0x248),local_108);
    pvVar3 = (void *)CONCAT44(local_108._4_4_,local_108._0_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,local_108._16_8_ - (long)pvVar3);
    }
  }
  lVar6 = *(long *)this;
  OneDimensionalWrapper::OneDimensionalWrapper
            ((OneDimensionalWrapper *)local_108,(CustomTabulated *)(lVar6 + 0x260),max_level,
             *(TypeOneDRule *)(lVar6 + 0x90),*(double *)(lVar6 + 0x98),*(double *)(lVar6 + 0xa0));
  lVar6 = *(long *)this;
  *(undefined4 *)(lVar6 + 0xb0) = local_108._8_4_;
  *(ulong *)(lVar6 + 0xa8) = CONCAT44(local_108._4_4_,local_108._0_4_);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar6 + 0xb8),
             (vector<int,_std::allocator<int>_> *)(local_108 + 0x10));
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar6 + 0xd0),
             (vector<int,_std::allocator<int>_> *)(local_108 + 0x28));
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(lVar6 + 0xe8),
             (vector<int,_std::allocator<int>_> *)(local_108 + 0x40));
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar6 + 0x100),
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(local_108 + 0x58));
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar6 + 0x118),
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_98);
  ::std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(lVar6 + 0x130),
             (vector<double,_std::allocator<double>_> *)(local_90 + 0x10));
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(lVar6 + 0x148),&local_68);
  OneDimensionalWrapper::~OneDimensionalWrapper((OneDimensionalWrapper *)local_108);
  this_00 = *(GridGlobal **)this;
  work = &(this_00->super_BaseCanonicalGrid).points;
  if ((this_00->super_BaseCanonicalGrid).points.indexes.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
      (this_00->super_BaseCanonicalGrid).points.indexes.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    work = &(this_00->super_BaseCanonicalGrid).needed;
  }
  GridGlobal::recomputeTensorRefs(this_00,work);
  return (__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
         )(__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
           )this;
}

Assistant:

static std::unique_ptr<GridGlobal> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridGlobal> grid = Utils::make_unique<GridGlobal>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->alpha = IO::readNumber<iomode, double>(is);
        grid->beta = IO::readNumber<iomode, double>(is);
        grid->rule = IO::readRule<iomode>(is);
        if (grid->rule == rule_customtabulated) grid->custom = CustomTabulated(is, iomode());
        grid->tensors = MultiIndexSet(is, iomode());
        grid->active_tensors = MultiIndexSet(is, iomode());
        grid->active_w = IO::readVector<iomode, int>(is, grid->active_tensors.getNumIndexes());

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        grid->max_levels = IO::readVector<iomode, int>(is, grid->num_dimensions);

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        int oned_max_level;
        if (IO::readFlag<iomode>(is)){
            grid->updated_tensors = MultiIndexSet(is, iomode());
            oned_max_level = grid->updated_tensors.getMaxIndex();

            grid->updated_active_tensors = MultiIndexSet(is, iomode());

            grid->updated_active_w = IO::readVector<iomode, int>(is, grid->updated_active_tensors.getNumIndexes());
        }else{
            oned_max_level = *std::max_element(grid->max_levels.begin(), grid->max_levels.end());
        }

        grid->wrapper = OneDimensionalWrapper(grid->custom, oned_max_level, grid->rule, grid->alpha, grid->beta);

        grid->recomputeTensorRefs((grid->points.empty()) ? grid->needed : grid->points);

        return grid;
    }